

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O2

EStatusCode __thiscall
CFFPrimitiveWriter::WriteRealOperand(CFFPrimitiveWriter *this,double inValue,long inFractalLength)

{
  bool bVar1;
  byte bVar2;
  byte inValue_00;
  EStatusCode EVar3;
  undefined4 uVar4;
  ushort uVar5;
  undefined8 unaff_R15;
  ulong uVar6;
  ulong in_XMM0_Qb;
  double dVar7;
  byte local_72;
  bool local_71;
  double local_70;
  double local_68;
  ulong uStack_60;
  undefined4 local_4c;
  double local_48;
  
  local_68 = -inValue;
  uStack_60 = in_XMM0_Qb ^ 0x8000000000000000;
  bVar1 = inValue < local_68;
  if (local_68 <= inValue) {
    local_68 = inValue;
  }
  local_48 = inValue;
  local_70 = floor(local_68);
  local_68 = local_68 - local_70;
  if ((local_68 != 0.0) || (NAN(local_68))) {
    if ((local_70 != 0.0) || ((NAN(local_70) || (0.001 < local_68)))) goto LAB_001c828d;
    uVar5 = 0;
    for (; local_68 < 0.1; local_68 = local_68 * 10.0) {
      uVar5 = uVar5 + 1;
    }
    uVar4 = 1;
    uVar6 = 0;
  }
  else if ((local_70 < 1000.0) || ((long)local_70 % 1000 != 0)) {
LAB_001c828d:
    uVar5 = 0;
    uVar4 = 0;
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    for (; (long)local_70 % 10 == 0; local_70 = local_70 / 10.0) {
      uVar5 = uVar5 + 1;
    }
    uVar6 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
    uVar4 = 0;
  }
  EVar3 = WriteByte(this,'\x1e');
  if (EVar3 == eSuccess) {
    local_72 = (0.0 <= local_48) * ' ' - 0x20;
    local_71 = bVar1;
    if ((local_70 != 0.0) || (NAN(local_70))) {
      EVar3 = WriteIntegerOfReal(this,local_70,&local_72,&local_71);
      bVar2 = local_71;
      if (EVar3 != eSuccess) goto LAB_001c82b0;
    }
    else if (0.0 <= local_48) {
      local_72 = 0;
      bVar2 = 1;
    }
    else {
      EVar3 = WriteByte(this,0xe0);
      local_72 = 0;
      if (EVar3 != eSuccess) goto LAB_001c82b0;
      bVar2 = 0;
    }
    if ((0 < inFractalLength) && ((local_68 != 0.0 || (NAN(local_68))))) {
      if ((bVar2 & 1) == 0) {
        local_72 = 0xa0;
        local_71 = true;
      }
      else {
        EVar3 = WriteByte(this,local_72 | 10);
        local_72 = 0;
        local_71 = false;
        if (EVar3 != eSuccess) goto LAB_001c82b0;
      }
      local_70 = (double)CONCAT44(local_70._4_4_,(int)uVar6);
      dVar7 = local_68;
      local_4c = uVar4;
      for (; ((dVar7 != 0.0 || (NAN(dVar7))) && (0 < inFractalLength));
          inFractalLength = inFractalLength + -1) {
        local_68 = dVar7;
        local_48 = floor(dVar7 * 10.0);
        EVar3 = SetOrWriteNibble(this,(Byte)(int)local_48,&local_72,&local_71);
        if (EVar3 != eSuccess) {
          return eFailure;
        }
        dVar7 = local_68 * 10.0 - local_48;
      }
      uVar6 = (ulong)local_70 & 0xffffffff;
      uVar4 = local_4c;
      bVar2 = local_71;
    }
    if ((char)uVar4 != '\0') {
      if ((bVar2 & 1) == 0) {
        local_72 = 0xc0;
        local_71 = true;
      }
      else {
        EVar3 = WriteByte(this,local_72 | 0xc);
        local_72 = 0;
        local_71 = false;
        if (EVar3 != eSuccess) goto LAB_001c82b0;
      }
      EVar3 = WriteIntegerOfReal(this,(double)uVar5,&local_72,&local_71);
      bVar2 = local_71;
      if (EVar3 != eSuccess) goto LAB_001c82b0;
    }
    if ((char)uVar6 != '\0') {
      if ((bVar2 & 1) == 0) {
        local_72 = 0xb0;
        local_71 = true;
      }
      else {
        EVar3 = WriteByte(this,local_72 | 0xb);
        local_72 = 0;
        local_71 = false;
        if (EVar3 != eSuccess) goto LAB_001c82b0;
      }
      EVar3 = WriteIntegerOfReal(this,(double)uVar5,&local_72,&local_71);
      bVar2 = local_71;
      if (EVar3 != eSuccess) goto LAB_001c82b0;
    }
    inValue_00 = 0xff;
    if ((bVar2 & 1) != 0) {
      inValue_00 = local_72 | 0xf;
    }
    EVar3 = WriteByte(this,inValue_00);
  }
  else {
LAB_001c82b0:
    EVar3 = eFailure;
  }
  return EVar3;
}

Assistant:

EStatusCode CFFPrimitiveWriter::WriteRealOperand(double inValue,long inFractalLength)
{
	// first, calculate the proper formatting
    
	bool minusSign = inValue < 0;
	bool minusExponent = false;
	bool plusExponent = false;
	unsigned short exponentSize = 0;
    
	if(minusSign)
		inValue = -inValue;
    
	double integerValue = floor(inValue);
	double fractalValue = inValue - integerValue;
    
	if(0 == fractalValue)
	{
		if(long(integerValue) % 1000 == 0 && integerValue >= 1000) // bother only if larger than 1000
		{
			plusExponent = true;
			while(long(integerValue) % 10 == 0)
			{
				++exponentSize;
				integerValue = integerValue / 10;
			}
		}
	}
    else if(0 == integerValue)
	{
		if(fractalValue <= 0.001) // bother only if < 0.001
		{
			minusExponent = true;
			while(fractalValue < 0.1)
			{
				++exponentSize;
				fractalValue = fractalValue * 10;
			}
		}
	}
    
	// now let's get to work
	if(WriteByte(30) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;
    
	// first, take care of minus sign
	Byte buffer = minusSign ? 0xe0 : 0;
	bool usedFirst = minusSign;
    
	// Integer part
	if(integerValue != 0)
	{
	        if(WriteIntegerOfReal(integerValue,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
        }
	else
	{
		if(SetOrWriteNibble(0,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}

	// Fractal part (if there was an integer or not)
	if(fractalValue != 0 && inFractalLength > 0)
	{
		if(SetOrWriteNibble(0xa,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;

		while(fractalValue != 0 && inFractalLength > 0)
		{
			if(SetOrWriteNibble((Byte)floor(fractalValue * 10),buffer,usedFirst) != PDFHummus::eSuccess)
				return PDFHummus::eFailure;
			fractalValue = fractalValue * 10 - floor(fractalValue * 10);
			--inFractalLength;
		}
	}
    
	// now, if there's any exponent, write it
	if(minusExponent)
	{
		if(SetOrWriteNibble(0xc,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
		if(WriteIntegerOfReal(exponentSize,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}
	if(plusExponent)
	{
		if(SetOrWriteNibble(0xb,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
		if(WriteIntegerOfReal(exponentSize,buffer,usedFirst) != PDFHummus::eSuccess)
			return PDFHummus::eFailure;
	}
    
	// final f or ff
	if(usedFirst)
		return SetOrWriteNibble(0xf,buffer,usedFirst);
	else
		return WriteByte(0xff);
    
}